

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlkf.cpp
# Opt level: O1

void __thiscall
icu_63::LocaleKeyFactory::updateVisibleIDs
          (LocaleKeyFactory *this,Hashtable *result,UErrorCode *status)

{
  uint uVar1;
  UnicodeString *that;
  UHashtable *hash;
  UErrorCode *pUVar2;
  int iVar3;
  undefined4 extraout_var;
  UHashElement *pUVar5;
  UnicodeString *this_00;
  int32_t *pos_00;
  int32_t pos;
  int32_t local_4c;
  undefined8 *local_48;
  LocaleKeyFactory *local_40;
  UErrorCode *local_38;
  undefined8 *puVar4;
  
  local_38 = status;
  iVar3 = (*(this->super_ICUServiceFactory).super_UObject._vptr_UObject[8])(this,status);
  puVar4 = (undefined8 *)CONCAT44(extraout_var,iVar3);
  if (puVar4 != (undefined8 *)0x0) {
    uVar1 = this->_coverage;
    pos_00 = &local_4c;
    local_4c = -1;
    local_40 = this;
    pUVar5 = uhash_nextElement_63((UHashtable *)*puVar4,pos_00);
    if (pUVar5 != (UHashElement *)0x0) {
      local_48 = puVar4;
      do {
        that = (UnicodeString *)(pUVar5->key).pointer;
        hash = result->hash;
        if ((uVar1 & 1) == 0) {
          this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pos_00);
          if (this_00 == (UnicodeString *)0x0) {
            this_00 = (UnicodeString *)0x0;
          }
          else {
            UnicodeString::UnicodeString(this_00,that);
          }
          pUVar2 = local_38;
          uhash_put_63(hash,this_00,local_40,local_38);
          puVar4 = local_48;
          if (U_ZERO_ERROR < *pUVar2) {
            return;
          }
        }
        else {
          uhash_remove_63(hash,that);
        }
        pos_00 = &local_4c;
        pUVar5 = uhash_nextElement_63((UHashtable *)*puVar4,&local_4c);
      } while (pUVar5 != (UHashElement *)0x0);
    }
  }
  return;
}

Assistant:

void
LocaleKeyFactory::updateVisibleIDs(Hashtable& result, UErrorCode& status) const {
    const Hashtable* supported = getSupportedIDs(status);
    if (supported) {
        UBool visible = (_coverage & 0x1) == 0;
        const UHashElement* elem = NULL;
        int32_t pos = UHASH_FIRST;
        while ((elem = supported->nextElement(pos)) != NULL) {
            const UnicodeString& id = *((const UnicodeString*)elem->key.pointer);
            if (!visible) {
                result.remove(id);
            } else {
                result.put(id, (void*)this, status); // this is dummy non-void marker used for set semantics
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
    }
}